

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_(chaiscript::Boxed_Number),_chaiscript::dispatch::detail::Fun_Caller<chaiscript::Boxed_Number,_chaiscript::Boxed_Number>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_(chaiscript::Boxed_Number),_chaiscript::dispatch::detail::Fun_Caller<chaiscript::Boxed_Number,_chaiscript::Boxed_Number>_>
           *this,Fun_Caller<chaiscript::Boxed_Number,_chaiscript::Boxed_Number> f)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  _func_Boxed_Number_Boxed_Number *in_stack_00000028;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffd0;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffd8;
  Proxy_Function_Impl_Base *in_stack_ffffffffffffffe0;
  
  dispatch::detail::build_param_type_list<chaiscript::Boxed_Number,chaiscript::Boxed_Number>
            (in_stack_00000028);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            (in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Proxy_Function_Callable_Impl_005c8b68;
  in_RDI[5] = in_RSI;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }